

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uchar *b32;
  uchar sizedesc [8];
  int iStack_5c;
  secp256k1_scalar sStack_58;
  secp256k1_scalar sStack_54;
  uchar local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  char local_19;
  
  uVar1 = hash->bytes;
  uVar4 = (uint)(uVar1 >> 0x3d);
  if (uVar1 >> 0x3d == 0) {
    local_1d = (undefined1)(uVar1 >> 0x1d);
    local_1e = (undefined1)(uVar1 >> 0x25);
    local_1f = (undefined1)(uVar1 >> 0x2d);
    local_20 = (uchar)(uVar1 >> 0x35);
    local_19 = (char)uVar1 * '\b';
    local_1a = (undefined1)(uVar1 >> 5);
    local_1b = (undefined1)(uVar1 >> 0xd);
    local_1c = (undefined1)(uVar1 >> 0x15);
    secp256k1_sha256_write
              (hash,secp256k1_sha256_finalize::pad,(ulong)(0x37U - (int)uVar1 & 0x3f) + 1);
    secp256k1_sha256_write(hash,&local_20,8);
    lVar3 = 0;
    do {
      uVar4 = hash->s[lVar3];
      *(uint *)(out32 + lVar3 * 4) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      hash->s[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    return;
  }
  secp256k1_sha256_finalize_cold_1();
  iStack_5c = 0;
  if (hash == (secp256k1_sha256 *)0x0) {
    secp256k1_ecdsa_recoverable_signature_parse_compact_cold_4();
  }
  else if ((secp256k1_ecdsa_recoverable_signature *)out32 !=
           (secp256k1_ecdsa_recoverable_signature *)0x0) {
    if (b32 == (uchar *)0x0) {
      secp256k1_ecdsa_recoverable_signature_parse_compact_cold_2();
      return;
    }
    if (3 < uVar4) {
      secp256k1_ecdsa_recoverable_signature_parse_compact_cold_1();
      return;
    }
    secp256k1_scalar_set_b32(&sStack_54,b32,&iStack_5c);
    iVar2 = iStack_5c;
    secp256k1_scalar_set_b32(&sStack_58,b32 + 0x20,&iStack_5c);
    if (iVar2 != 0 || iStack_5c != 0) {
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x30] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x31] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x32] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x33] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x34] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x35] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x36] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x37] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x38] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x39] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x3a] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x3b] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x3c] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x3d] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x3e] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x3f] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x20] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x21] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x22] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x23] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x24] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x25] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x26] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x27] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x28] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x29] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x2a] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x2b] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x2c] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x2d] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x2e] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x2f] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x10] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x11] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x12] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x13] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x14] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x15] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x16] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x17] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x18] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x19] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x1a] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x1b] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x1c] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x1d] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x1e] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x1f] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[1] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[2] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[3] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[4] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[5] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[6] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[7] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[8] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[9] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[10] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0xb] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0xc] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0xd] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0xe] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0xf] = '\0';
      ((secp256k1_ecdsa_recoverable_signature *)out32)->data[0x40] = '\0';
      return;
    }
    secp256k1_ecdsa_recoverable_signature_save
              ((secp256k1_ecdsa_recoverable_signature *)out32,&sStack_54,&sStack_58,uVar4);
    return;
  }
  secp256k1_ecdsa_recoverable_signature_parse_compact_cold_3();
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    int i;
    /* The maximum message size of SHA256 is 2^64-1 bits. */
    VERIFY_CHECK(hash->bytes < ((uint64_t)1 << 61));
    secp256k1_write_be32(&sizedesc[0], hash->bytes >> 29);
    secp256k1_write_be32(&sizedesc[4], hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, sizedesc, 8);
    for (i = 0; i < 8; i++) {
        secp256k1_write_be32(&out32[4*i], hash->s[i]);
        hash->s[i] = 0;
    }
}